

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  ulong uVar1;
  char *pcVar2;
  short *psVar3;
  byte bVar4;
  U16 UVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ushort uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  byte *pbVar26;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  U16 valPerRank [13];
  rankPos rank [32];
  unkbyte10 Stack_158;
  undefined6 local_14e;
  unkbyte10 Stack_148;
  uint local_138 [2];
  undefined2 uStack_130;
  undefined6 uStack_12e;
  undefined8 local_128;
  undefined2 uStack_120;
  undefined6 uStack_11e;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  uint local_48;
  
  sVar11 = 0xffffffffffffffff;
  if ((((ulong)workSpace & 3) == 0) && (sVar11 = 0xffffffffffffffbe, 0xfff < wkspSize)) {
    uVar18 = 0xb;
    if (maxNbBits != 0) {
      uVar18 = maxNbBits;
    }
    sVar11 = 0xffffffffffffffd2;
    if (maxSymbolValue < 0x100) {
      uVar17 = 0;
      memset(workSpace,0,0x1000);
      memset(local_138,0,0x100);
      uVar16 = (ulong)(maxSymbolValue + 1);
      do {
        uVar28 = 0x1f;
        if (count[uVar17] + 1 != 0) {
          for (; count[uVar17] + 1 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        local_138[(ulong)uVar28 * 2] = local_138[(ulong)uVar28 * 2] + 1;
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
      lVar10 = 0x1d;
      do {
        local_48 = local_48 + local_138[lVar10 * 2];
        local_138[lVar10 * 2] = local_48;
        bVar29 = lVar10 != 0;
        lVar10 = lVar10 + -1;
      } while (bVar29);
      lVar10 = 0;
      do {
        local_138[lVar10 * 2 + 1] = local_138[lVar10 * 2];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      uVar17 = 0;
      do {
        uVar28 = count[uVar17];
        uVar22 = 0x1f;
        if (uVar28 + 1 != 0) {
          for (; uVar28 + 1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
          }
        }
        uVar24 = (ulong)((uVar22 ^ 0x1fffffe0) * 8 + 0x108);
        uVar22 = *(uint *)((long)local_138 + uVar24);
        uVar19 = *(uint *)((long)local_138 + uVar24 + 4);
        uVar15 = (ulong)uVar19;
        *(uint *)((long)local_138 + uVar24 + 4) = uVar19 + 1;
        uVar24 = uVar15;
        if (uVar22 < uVar19) {
          do {
            uVar24 = uVar24 - 1;
            if (uVar28 <= *(uint *)((long)workSpace + (uVar24 & 0xffffffff) * 8 + 8))
            goto LAB_004b7601;
            *(undefined8 *)((long)workSpace + uVar24 * 8 + 0x10) =
                 *(undefined8 *)((long)workSpace + (uVar24 & 0xffffffff) * 8 + 8);
            uVar19 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar19;
          } while (uVar22 < uVar19);
          uVar15 = (ulong)uVar22;
        }
LAB_004b7601:
        *(uint *)((long)workSpace + uVar15 * 8 + 8) = uVar28;
        *(char *)((long)workSpace + uVar15 * 8 + 0xe) = (char)uVar17;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar16);
      uVar28 = maxSymbolValue + 0x100;
      do {
        uVar22 = uVar28;
        uVar17 = (ulong)(uVar22 - 0x100);
        uVar28 = uVar22 - 1;
      } while (*(int *)((long)workSpace + uVar17 * 8 + 8) == 0);
      lVar10 = (long)(int)(uVar22 - 0x100);
      *(int *)((long)workSpace + 0x808) =
           *(int *)((long)workSpace + lVar10 * 8) + *(int *)((long)workSpace + lVar10 * 8 + 8);
      *(undefined2 *)((long)workSpace + lVar10 * 8 + 4) = 0x100;
      *(undefined2 *)((long)workSpace + lVar10 * 8 + 0xc) = 0x100;
      auVar9 = _DAT_005520b0;
      auVar8 = _DAT_005520a0;
      auVar7 = _DAT_00552090;
      uVar24 = (ulong)uVar28;
      uVar19 = uVar22 - 0x102;
      if (uVar28 < 0x101) {
        *(undefined4 *)workSpace = 0x80000000;
      }
      else {
        lVar10 = uVar24 - 0x101;
        auVar30._8_4_ = (int)lVar10;
        auVar30._0_8_ = lVar10;
        auVar30._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar15 = 0;
        auVar30 = auVar30 ^ _DAT_005520b0;
        do {
          auVar31._8_4_ = (int)uVar15;
          auVar31._0_8_ = uVar15;
          auVar31._12_4_ = (int)(uVar15 >> 0x20);
          auVar32 = (auVar31 | auVar8) ^ auVar9;
          iVar21 = auVar30._4_4_;
          if ((bool)(~(auVar32._4_4_ == iVar21 && auVar30._0_4_ < auVar32._0_4_ ||
                      iVar21 < auVar32._4_4_) & 1)) {
            *(undefined4 *)((long)workSpace + uVar15 * 8 + 0x810) = 0x40000000;
          }
          if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
              auVar32._12_4_ <= auVar30._12_4_) {
            *(undefined4 *)((long)workSpace + uVar15 * 8 + 0x818) = 0x40000000;
          }
          auVar31 = (auVar31 | auVar7) ^ auVar9;
          iVar33 = auVar31._4_4_;
          if (iVar33 <= iVar21 && (iVar33 != iVar21 || auVar31._0_4_ <= auVar30._0_4_)) {
            *(undefined4 *)((long)workSpace + uVar15 * 8 + 0x820) = 0x40000000;
            *(undefined4 *)((long)workSpace + uVar15 * 8 + 0x828) = 0x40000000;
          }
          uVar15 = uVar15 + 4;
        } while ((uVar24 - 0xfd & 0xfffffffffffffffc) != uVar15);
        *(undefined4 *)workSpace = 0x80000000;
        if (0x100 < uVar28) {
          uVar14 = 0x100;
          uVar20 = 0x101;
          do {
            uVar13 = *(uint *)((long)workSpace + (long)(int)uVar19 * 8 + 8);
            uVar23 = *(uint *)((long)workSpace + (long)(int)uVar14 * 8 + 8);
            uVar27 = (uVar14 + 1) - (uint)(uVar13 < uVar23);
            uVar6 = uVar14;
            if (uVar13 < uVar23) {
              uVar6 = uVar19;
            }
            uVar14 = (uint)(uVar13 < uVar23);
            uVar25 = uVar19 - uVar14;
            uVar13 = *(uint *)((long)workSpace + (long)(int)uVar25 * 8 + 8);
            uVar23 = *(uint *)((long)workSpace + (long)(int)uVar27 * 8 + 8);
            uVar19 = (uVar19 - uVar14) - (uint)(uVar13 < uVar23);
            uVar14 = (uVar27 + 1) - (uint)(uVar13 < uVar23);
            if (uVar23 <= uVar13) {
              uVar25 = uVar27;
            }
            *(int *)((long)workSpace + (ulong)uVar20 * 8 + 8) =
                 *(int *)((long)workSpace + (ulong)uVar25 * 8 + 8) +
                 *(int *)((long)workSpace + (ulong)uVar6 * 8 + 8);
            *(ushort *)((long)workSpace + (ulong)uVar25 * 8 + 0xc) = uVar20;
            *(ushort *)((long)workSpace + (ulong)uVar6 * 8 + 0xc) = uVar20;
            uVar20 = uVar20 + 1;
          } while (uVar20 <= uVar28);
        }
      }
      *(undefined1 *)((long)workSpace + uVar24 * 8 + 0xf) = 0;
      if (uVar22 - 0x102 < 0xffffff00) {
        uVar24 = (ulong)(uVar22 - 2);
        do {
          uVar24 = uVar24 - 1;
          *(char *)((long)workSpace + uVar24 * 8 + 0x17) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar24 * 8 + 0x14) * 8 + 0xf) + '\x01';
        } while ((uVar24 & 0xffffff00) != 0);
      }
      uVar24 = 0xffffffffffffffff;
      do {
        *(char *)((long)workSpace + uVar24 * 8 + 0x17) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + uVar24 * 8 + 0x14) * 8 + 0xf) + '\x01';
        uVar24 = uVar24 + 1;
      } while (uVar24 < uVar17);
      bVar4 = *(byte *)((long)workSpace + uVar17 * 8 + 0xf);
      uVar19 = (uint)bVar4;
      uVar28 = (uint)bVar4;
      if (uVar18 <= uVar19 && uVar19 - uVar18 != 0) {
        bVar12 = (byte)(uVar19 - uVar18);
        pbVar26 = (byte *)((long)workSpace + uVar17 * 8 + 0xf);
        iVar21 = 0;
        uVar28 = uVar22 - 0x101;
        uVar22 = uVar19;
        do {
          uVar14 = uVar28;
          iVar21 = (-1 << (bVar4 - (char)uVar22 & 0x1f)) + iVar21 + (1 << (bVar12 & 0x1f));
          *pbVar26 = (byte)uVar18;
          pbVar26 = (byte *)((long)workSpace + (ulong)uVar14 * 8 + 0xf);
          uVar22 = (uint)*pbVar26;
          uVar28 = uVar14 - 1;
        } while (uVar18 < *pbVar26);
        uVar24 = (ulong)(uVar14 + 1);
        do {
          uVar28 = (int)uVar24 - 1;
          uVar24 = (ulong)uVar28;
        } while (uVar18 == *(byte *)((long)workSpace + uVar24 * 8 + 0xf));
        uVar22 = iVar21 >> (bVar12 & 0x1f);
        local_108 = 0xf0f0f0f0f0f0f0f0;
        local_118 = 0xf0f0f0f0f0f0f0f0;
        uStack_110 = 0xf0f0f0f0f0f0f0f0;
        local_128 = 0xf0f0f0f0f0f0f0f0;
        uStack_120 = 0xf0f0;
        uStack_11e = 0xf0f0f0f0f0f0;
        local_138[0] = 0xf0f0f0f0;
        local_138[1] = 0xf0f0f0f0;
        uStack_130 = 0xf0f0;
        uStack_12e = 0xf0f0f0f0f0f0;
        if (-1 < (int)uVar28) {
          pbVar26 = (byte *)((long)workSpace + uVar24 * 8 + 0xf);
          uVar15 = uVar24;
          uVar28 = uVar18;
          do {
            uVar14 = (uint)uVar15;
            if (*pbVar26 < uVar28) {
              uVar28 = (uint)*pbVar26;
              local_138[uVar18 - uVar28] = uVar14;
            }
            uVar15 = uVar15 - 1;
            pbVar26 = pbVar26 + -8;
          } while (0 < (int)uVar14);
        }
        for (; 0 < (int)uVar22; uVar22 = (-1 << ((byte)uVar13 & 0x1f)) + uVar22) {
          uVar28 = 0x1f;
          if (uVar22 != 0) {
            for (; uVar22 >> uVar28 == 0; uVar28 = uVar28 - 1) {
            }
          }
          if ((uVar28 ^ 0x1f) != 0x1f) {
            uVar15 = (ulong)(0x20 - (uVar28 ^ 0x1f));
            do {
              uVar1 = uVar15 - 1;
              if (((ulong)local_138[uVar15] != 0xf0f0f0f0) &&
                 ((local_138[uVar1 & 0xffffffff] == 0xf0f0f0f0 ||
                  (*(uint *)((long)workSpace + (ulong)local_138[uVar15] * 8 + 8) <=
                   (uint)(*(int *)((long)workSpace + (ulong)local_138[uVar1 & 0xffffffff] * 8 + 8) *
                         2))))) {
                if (0xc < uVar15) goto LAB_004b79f4;
                goto LAB_004b79d2;
              }
              uVar15 = uVar1;
            } while ((uVar1 & 0xfffffffe) != 0);
          }
          uVar15 = 1;
LAB_004b79d2:
          do {
            if (local_138[uVar15] != 0xf0f0f0f0) goto LAB_004b79f4;
            uVar15 = uVar15 + 1;
          } while (uVar15 != 0xd);
          uVar15 = 0xd;
LAB_004b79f4:
          uVar13 = (int)uVar15 - 1;
          uVar28 = local_138[uVar15 & 0xffffffff];
          uVar14 = local_138[uVar13];
          if (local_138[uVar13] == 0xf0f0f0f0) {
            uVar14 = uVar28;
          }
          local_138[uVar13] = uVar14;
          pcVar2 = (char *)((long)workSpace + (ulong)uVar28 * 8 + 0xf);
          *pcVar2 = *pcVar2 + '\x01';
          if ((ulong)uVar28 == 0) {
            uVar28 = 0xf0f0f0f0;
          }
          else {
            uVar28 = uVar28 - 1;
            if (uVar18 - (int)uVar15 != (uint)*(byte *)((long)workSpace + (ulong)uVar28 * 8 + 0xf))
            {
              uVar28 = 0xf0f0f0f0;
            }
          }
          local_138[uVar15 & 0xffffffff] = uVar28;
        }
        uVar28 = uVar18;
        if ((int)uVar22 < 0) {
          uVar15 = (ulong)local_138[1];
          do {
            uVar14 = (uint)uVar15;
            uVar13 = uVar14 + 0xf0f0f10;
            uVar23 = 0;
            while (uVar14 = uVar14 + 1, uVar13 != uVar23) {
              pcVar2 = (char *)((long)workSpace + (ulong)uVar14 * 8 + 0xf);
              *pcVar2 = *pcVar2 + -1;
              uVar23 = uVar23 - 1;
              if (uVar22 == uVar23) goto LAB_004b7a68;
            }
            iVar21 = uVar22 - uVar23;
            uVar15 = uVar24;
            do {
              uVar24 = uVar15;
              uVar15 = (ulong)((int)uVar24 - 1);
            } while (uVar18 == *(byte *)((long)workSpace + uVar24 * 8 + 0xf));
            uVar15 = (ulong)((int)uVar24 + 1);
            pcVar2 = (char *)((long)workSpace + uVar15 * 8 + 0xf);
            *pcVar2 = *pcVar2 + -1;
            uVar22 = iVar21 + 1;
          } while (iVar21 < -1);
        }
      }
LAB_004b7a68:
      local_128 = 0;
      uStack_120 = 0;
      local_138[0] = 0;
      local_138[1] = 0;
      uStack_130 = 0;
      uStack_12e = 0;
      Stack_148 = SUB1610((undefined1  [16])0x0,6);
      Stack_158 = SUB1610((undefined1  [16])0x0,0);
      local_14e = 0;
      if (uVar28 < 0xd) {
        uVar24 = 0xffffffffffffffff;
        do {
          psVar3 = (short *)((long)local_138 +
                            (ulong)*(byte *)((long)workSpace + uVar24 * 8 + 0x17) * 2);
          *psVar3 = *psVar3 + 1;
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar17);
        if (uVar28 != 0) {
          if (uVar18 < uVar19) {
            uVar19 = uVar18;
          }
          uVar17 = (ulong)(uVar19 * 2);
          uVar20 = 0;
          do {
            *(ushort *)((long)&Stack_158 + uVar17) = uVar20;
            uVar20 = (ushort)(uVar20 + *(short *)((long)local_138 + uVar17)) >> 1;
            uVar17 = uVar17 - 2;
          } while ((int)uVar17 != 0);
        }
        uVar17 = 0;
        do {
          tree[*(byte *)((long)workSpace + uVar17 * 8 + 0xe)].nbBits =
               *(BYTE *)((long)workSpace + uVar17 * 8 + 0xf);
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
        uVar17 = 0;
        do {
          UVar5 = *(U16 *)((long)&Stack_158 + (ulong)tree[uVar17].nbBits * 2);
          *(U16 *)((long)&Stack_158 + (ulong)tree[uVar17].nbBits * 2) = UVar5 + 1;
          tree[uVar17].val = UVar5;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      sVar11 = 0xffffffffffffffff;
      if (uVar28 < 0xd) {
        sVar11 = (ulong)uVar28;
      }
    }
  }
  return sVar11;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    nodeElt* const huffNode0 = (nodeElt*)workSpace;
    nodeElt* const huffNode = huffNode0+1;
    U32 n, nonNullRank;
    int lowS, lowN;
    U16 nodeNb = STARTNODE;
    U32 nodeRoot;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(huffNodeTable)) return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue);

    /* init for parents */
    nonNullRank = maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        U32 n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        U32 n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, nonNullRank, maxNbBits);

    /* fill result into tree (val, nbBits) */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
        U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
        if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */
        for (n=0; n<=nonNullRank; n++)
            nbPerRank[huffNode[n].nbBits]++;
        /* determine stating value per rank */
        {   U16 min = 0;
            for (n=maxNbBits; n>0; n--) {
                valPerRank[n] = min;      /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        for (n=0; n<=maxSymbolValue; n++)
            tree[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
        for (n=0; n<=maxSymbolValue; n++)
            tree[n].val = valPerRank[tree[n].nbBits]++;   /* assign value within rank, symbol order */
    }

    return maxNbBits;
}